

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityPrint(char *string)

{
  byte *pbVar1;
  uint __c;
  char *pch;
  byte bVar2;
  
  if ((string != (char *)0x0) && (bVar2 = *string, bVar2 != 0)) {
    pbVar1 = (byte *)(string + 1);
    do {
      if ((byte)(bVar2 - 0x20) < 0x5f) {
        __c = (uint)bVar2;
LAB_00102e84:
        putchar(__c);
      }
      else {
        putchar(0x5c);
        if (bVar2 == 10) {
          __c = 0x6e;
          goto LAB_00102e84;
        }
        if (bVar2 == 0xd) {
          __c = 0x72;
          goto LAB_00102e84;
        }
        putchar(0x78);
        UnityPrintNumberHex((long)(char)pbVar1[-1],'\x02');
      }
      bVar2 = *pbVar1;
      pbVar1 = pbVar1 + 1;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

void UnityPrint(const char* string)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch)
        {
#ifdef UNITY_OUTPUT_COLOR
            /* print ANSI escape code */
            if ((*pch == 27) && (*(pch + 1) == '['))
            {
                pch += UnityPrintAnsiEscapeString(pch);
                continue;
            }
#endif
            UnityPrintChar(pch);
            pch++;
        }
    }
}